

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

hittable_list * cornell_smoke(void)

{
  vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_> *this;
  hittable_list *in_RDI;
  shared_ptr<lambertian> white;
  shared_ptr<diffuse_light> light;
  shared_ptr<lambertian> green;
  shared_ptr<lambertian> red;
  vec3 local_188;
  undefined1 local_170 [8];
  vec3 local_168;
  undefined1 local_148 [16];
  vec3 local_138;
  undefined1 local_11c [4];
  undefined8 local_118;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_110 [2];
  hittable_list *local_100;
  shared_ptr<constant_texture> local_f8;
  shared_ptr<constant_texture> local_e8;
  shared_ptr<constant_texture> local_d8;
  shared_ptr<constant_texture> local_c8;
  value_type local_b8;
  value_type local_a8;
  value_type local_98;
  value_type local_88;
  value_type local_78;
  value_type local_68;
  value_type local_58;
  value_type local_48;
  
  (in_RDI->super_hittable)._vptr_hittable = (_func_int **)&PTR_hit_0012c0f8;
  (in_RDI->objects).
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->objects).
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (in_RDI->objects).
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_168.e[0] = 0.65;
  local_168.e[1] = 0.05;
  local_168.e[2] = 0.05;
  local_100 = in_RDI;
  std::make_shared<constant_texture,vec3>(&local_188);
  std::make_shared<lambertian,std::shared_ptr<constant_texture>>(&local_c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_188.e + 1));
  local_168.e[0] = 0.73;
  local_168.e[1] = 0.73;
  local_168.e[2] = 0.73;
  std::make_shared<constant_texture,vec3>(&local_188);
  std::make_shared<lambertian,std::shared_ptr<constant_texture>>(&local_f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_188.e + 1));
  local_168.e[0] = 0.12;
  local_168.e[1] = 0.45;
  local_168.e[2] = 0.15;
  std::make_shared<constant_texture,vec3>(&local_188);
  std::make_shared<lambertian,std::shared_ptr<constant_texture>>(&local_d8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_188.e + 1));
  local_168.e[0] = 7.0;
  local_168.e[1] = 7.0;
  local_168.e[2] = 7.0;
  std::make_shared<constant_texture,vec3>(&local_188);
  std::make_shared<diffuse_light,std::shared_ptr<constant_texture>>(&local_e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_188.e + 1));
  local_118._0_4_ = 0;
  local_138.e[0]._0_4_ = 0x22b;
  local_148._0_4_ = 0;
  local_170._0_4_ = 0x22b;
  local_11c = (undefined1  [4])0x22b;
  std::make_shared<yz_rect,int,int,int,int,int,std::shared_ptr<lambertian>&>
            ((int *)&local_188,(int *)&local_118,(int *)&local_138,(int *)local_148,(int *)local_170
             ,(shared_ptr<lambertian> *)local_11c);
  std::make_shared<flip_face,std::shared_ptr<yz_rect>>((shared_ptr<yz_rect> *)&local_168);
  this = &in_RDI->objects;
  local_48.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_168.e[0];
  local_48.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168.e[1];
  local_168.e[0] = 0.0;
  local_168.e[1] = 0.0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (this,&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_168.e + 1));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_188.e + 1));
  local_188.e[0]._0_4_ = 0;
  local_138.e[0]._0_4_ = 0;
  local_118._0_4_ = 0x22b;
  local_148._0_4_ = 0x22b;
  local_170._0_4_ = 0;
  std::make_shared<yz_rect,int,int,int,int,int,std::shared_ptr<lambertian>&>
            ((int *)&local_168,(int *)&local_188,(int *)&local_118,(int *)&local_138,
             (int *)local_148,(shared_ptr<lambertian> *)local_170);
  local_58.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_168.e[0];
  local_58.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168.e[1];
  local_168.e[0] = 0.0;
  local_168.e[1] = 0.0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (this,&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_58.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_168.e + 1));
  local_188.e[0]._0_4_ = 0x71;
  local_118._0_4_ = 0x1bb;
  local_138.e[0]._0_4_ = 0x7f;
  local_148._0_4_ = 0x1b0;
  local_170._0_4_ = 0x22a;
  std::make_shared<xz_rect,int,int,int,int,int,std::shared_ptr<diffuse_light>&>
            ((int *)&local_168,(int *)&local_188,(int *)&local_118,(int *)&local_138,
             (int *)local_148,(shared_ptr<diffuse_light> *)local_170);
  local_68.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_168.e[0];
  local_68.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168.e[1];
  local_168.e[0] = 0.0;
  local_168.e[1] = 0.0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (this,&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_68.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_168.e + 1));
  local_118._0_4_ = 0;
  local_138.e[0]._0_4_ = 0x22b;
  local_148._0_4_ = 0;
  local_170._0_4_ = 0x22b;
  local_11c = (undefined1  [4])0x22b;
  std::make_shared<xz_rect,int,int,int,int,int,std::shared_ptr<lambertian>&>
            ((int *)&local_188,(int *)&local_118,(int *)&local_138,(int *)local_148,(int *)local_170
             ,(shared_ptr<lambertian> *)local_11c);
  std::make_shared<flip_face,std::shared_ptr<xz_rect>>((shared_ptr<xz_rect> *)&local_168);
  local_78.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_168.e[0];
  local_78.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168.e[1];
  local_168.e[0] = 0.0;
  local_168.e[1] = 0.0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (this,&local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_78.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_168.e + 1));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_188.e + 1));
  local_188.e[0] = (double)((ulong)local_188.e[0]._4_4_ << 0x20);
  local_138.e[0]._0_4_ = 0;
  local_118._0_4_ = 0x22b;
  local_148._0_4_ = 0x22b;
  local_170._0_4_ = 0;
  std::make_shared<xz_rect,int,int,int,int,int,std::shared_ptr<lambertian>&>
            ((int *)&local_168,(int *)&local_188,(int *)&local_118,(int *)&local_138,
             (int *)local_148,(shared_ptr<lambertian> *)local_170);
  local_88.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_168.e[0];
  local_88.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168.e[1];
  local_168.e[0] = 0.0;
  local_168.e[1] = 0.0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (this,&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_88.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_168.e + 1));
  local_118 = (double)((ulong)local_118._4_4_ << 0x20);
  local_138.e[0] = (double)CONCAT44(local_138.e[0]._4_4_,0x22b);
  local_148._0_8_ = (ulong)(uint)local_148._4_4_ << 0x20;
  local_170._0_4_ = 0x22b;
  local_11c = (undefined1  [4])0x22b;
  std::make_shared<xy_rect,int,int,int,int,int,std::shared_ptr<lambertian>&>
            ((int *)&local_188,(int *)&local_118,(int *)&local_138,(int *)local_148,(int *)local_170
             ,(shared_ptr<lambertian> *)local_11c);
  std::make_shared<flip_face,std::shared_ptr<xy_rect>>((shared_ptr<xy_rect> *)&local_168);
  local_98.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_168.e[0];
  local_98.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168.e[1];
  local_168.e[0] = 0.0;
  local_168.e[1] = 0.0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (this,&local_98);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_98.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_168.e + 1));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_188.e + 1));
  local_168.e[0] = 0.0;
  local_168.e[1] = 0.0;
  local_168.e[2] = 0.0;
  local_188.e[0] = 165.0;
  local_188.e[1] = 330.0;
  local_188.e[2] = 165.0;
  std::make_shared<box,vec3,vec3,std::shared_ptr<lambertian>&>
            (&local_138,&local_168,(shared_ptr<lambertian> *)&local_188);
  local_118 = local_138.e[0];
  a_Stack_110[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138.e[1];
  local_138.e[0] = 0.0;
  local_138.e[1] = 0.0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_138.e + 1));
  local_188.e[0] = (double)CONCAT44(local_188.e[0]._4_4_,0xf);
  std::make_shared<rotate_y,std::shared_ptr<hittable>&,int>
            ((shared_ptr<hittable> *)&local_168,(int *)&local_118);
  std::__shared_ptr<hittable,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<hittable,(__gnu_cxx::_Lock_policy)2> *)&local_118,
             (__shared_ptr<rotate_y,_(__gnu_cxx::_Lock_policy)2> *)&local_168);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_168.e + 1));
  local_168.e[0] = 265.0;
  local_168.e[1] = 0.0;
  local_168.e[2] = 295.0;
  std::make_shared<translate,std::shared_ptr<hittable>&,vec3>
            ((shared_ptr<hittable> *)&local_188,(vec3 *)&local_118);
  std::__shared_ptr<hittable,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<hittable,(__gnu_cxx::_Lock_policy)2> *)&local_118,
             (__shared_ptr<translate,_(__gnu_cxx::_Lock_policy)2> *)&local_188);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_188.e + 1));
  local_168.e[2] = 0.0;
  local_168.e[0] = 0.0;
  local_168.e[1] = 0.0;
  local_188.e[0] = 165.0;
  local_188.e[1] = 165.0;
  local_188.e[2] = 165.0;
  std::make_shared<box,vec3,vec3,std::shared_ptr<lambertian>&>
            ((vec3 *)local_148,&local_168,(shared_ptr<lambertian> *)&local_188);
  local_138.e[0] = (double)local_148._0_8_;
  local_138.e[1] = (double)local_148._8_8_;
  local_148._0_8_ = 0.0;
  local_148._8_8_ = 0.0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_148 + 8));
  local_188.e[0] = (double)CONCAT44(local_188.e[0]._4_4_,0xffffffee);
  std::make_shared<rotate_y,std::shared_ptr<hittable>&,int>
            ((shared_ptr<hittable> *)&local_168,(int *)&local_138);
  std::__shared_ptr<hittable,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<hittable,(__gnu_cxx::_Lock_policy)2> *)&local_138,
             (__shared_ptr<rotate_y,_(__gnu_cxx::_Lock_policy)2> *)&local_168);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_168.e + 1));
  local_168.e[0] = 130.0;
  local_168.e[1] = 0.0;
  local_168.e[2] = 65.0;
  std::make_shared<translate,std::shared_ptr<hittable>&,vec3>
            ((shared_ptr<hittable> *)&local_188,&local_138);
  std::__shared_ptr<hittable,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<hittable,(__gnu_cxx::_Lock_policy)2> *)&local_138,
             (__shared_ptr<translate,_(__gnu_cxx::_Lock_policy)2> *)&local_188);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_188.e + 1));
  local_170 = (undefined1  [8])0x3f847ae147ae147b;
  local_168.e[0] = 0.0;
  local_168.e[1] = 0.0;
  local_168.e[2] = 0.0;
  std::make_shared<constant_texture,vec3>((vec3 *)local_148);
  std::
  make_shared<constant_medium,std::shared_ptr<hittable>&,double,std::shared_ptr<constant_texture>>
            ((shared_ptr<hittable> *)&local_188,(double *)&local_118,
             (shared_ptr<constant_texture> *)local_170);
  local_a8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_188.e[0];
  local_a8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188.e[1];
  local_188.e[0] = 0.0;
  local_188.e[1] = 0.0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (this,&local_a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_a8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_188.e + 1));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_148 + 8));
  local_170 = (undefined1  [8])0x3f847ae147ae147b;
  local_168.e[0] = 1.0;
  local_168.e[1] = 1.0;
  local_168.e[2] = 1.0;
  std::make_shared<constant_texture,vec3>((vec3 *)local_148);
  std::
  make_shared<constant_medium,std::shared_ptr<hittable>&,double,std::shared_ptr<constant_texture>>
            ((shared_ptr<hittable> *)&local_188,local_138.e,
             (shared_ptr<constant_texture> *)local_170);
  local_b8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_188.e[0];
  local_b8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188.e[1];
  local_188.e[0] = 0.0;
  local_188.e[1] = 0.0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (this,&local_b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_188.e + 1));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_148 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_138.e + 1));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_110);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_e8.super___shared_ptr<constant_texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_d8.super___shared_ptr<constant_texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_f8.super___shared_ptr<constant_texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_c8.super___shared_ptr<constant_texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  return local_100;
}

Assistant:

hittable_list cornell_smoke() {
    hittable_list objects;

    auto red = make_shared<lambertian>(make_shared<constant_texture>(vec3(0.65, 0.05, 0.05)));
    auto white = make_shared<lambertian>(make_shared<constant_texture>(vec3(0.73, 0.73, 0.73)));
    auto green = make_shared<lambertian>(make_shared<constant_texture>(vec3(0.12, 0.45, 0.15)));
    auto light = make_shared<diffuse_light>(make_shared<constant_texture>(vec3(7, 7, 7)));

    objects.add(make_shared<flip_face>(make_shared<yz_rect>(0, 555, 0, 555, 555, green)));
    objects.add(make_shared<yz_rect>(0, 555, 0, 555, 0, red));
    objects.add(make_shared<xz_rect>(113, 443, 127, 432, 554, light));
    objects.add(make_shared<flip_face>(make_shared<xz_rect>(0, 555, 0, 555, 555, white)));
    objects.add(make_shared<xz_rect>(0, 555, 0, 555, 0, white));
    objects.add(make_shared<flip_face>(make_shared<xy_rect>(0, 555, 0, 555, 555, white)));

    shared_ptr<hittable> box1 = make_shared<box>(vec3(0,0,0), vec3(165,330,165), white);
    box1 = make_shared<rotate_y>(box1,  15);
    box1 = make_shared<translate>(box1, vec3(265,0,295));

    shared_ptr<hittable> box2 = make_shared<box>(vec3(0,0,0), vec3(165,165,165), white);
    box2 = make_shared<rotate_y>(box2, -18);
    box2 = make_shared<translate>(box2, vec3(130,0,65));

    objects.add(
            make_shared<constant_medium>(box1, 0.01, make_shared<constant_texture>(vec3(0,0,0))));
    objects.add(
            make_shared<constant_medium>(box2, 0.01, make_shared<constant_texture>(vec3(1,1,1))));

    return objects;
}